

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::TopLabelExpr
          (BinaryReaderIR *this,LabelNode **label,Expr **expr)

{
  Result RVar1;
  reference pvVar2;
  Enum EVar3;
  LabelNode *parent_label;
  
  RVar1 = TopLabel(this,label);
  if (RVar1.enum_ == Error) {
    EVar3 = Error;
  }
  else {
    EVar3 = Error;
    RVar1 = GetLabelAt(this,&parent_label,1);
    if (RVar1.enum_ != Error) {
      pvVar2 = intrusive_list<wabt::Expr>::back(parent_label->exprs);
      *expr = pvVar2;
      EVar3 = Ok;
    }
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderIR::TopLabelExpr(LabelNode** label, Expr** expr) {
  CHECK_RESULT(TopLabel(label));
  LabelNode* parent_label;
  CHECK_RESULT(GetLabelAt(&parent_label, 1));
  *expr = &parent_label->exprs->back();
  return Result::Ok;
}